

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O1

char * ODDLParser::OpenDDLParser::parseReference
                 (char *in,char *end,
                 vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_> *names)

{
  pointer *pppNVar1;
  byte bVar2;
  iterator iVar3;
  byte *pbVar4;
  Name *nextName;
  Name *local_38;
  
  if (in != end && in != (char *)0x0) {
    local_38 = (Name *)0x0;
    in = parseName(in,end,&local_38);
    if (local_38 != (Name *)0x0) {
      iVar3._M_current =
           (names->super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (names->super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<ODDLParser::Name*,std::allocator<ODDLParser::Name*>>::
        _M_realloc_insert<ODDLParser::Name*const&>
                  ((vector<ODDLParser::Name*,std::allocator<ODDLParser::Name*>> *)names,iVar3,
                   &local_38);
      }
      else {
        *iVar3._M_current = local_38;
        pppNVar1 = &(names->
                    super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppNVar1 = *pppNVar1 + 1;
      }
    }
    bVar2 = *in;
    while (pbVar4 = (byte *)in, bVar2 == 0x2c) {
      for (; in != end; in = (char *)((byte *)in + 1)) {
        bVar2 = *in;
        pbVar4 = (byte *)in;
        if ((((ulong)bVar2 < 0x2d) && ((0x130100000200U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) ||
           ((bVar2 - 0x5b < 0x23 && ((0x500000001U >> ((ulong)(bVar2 - 0x5b) & 0x3f) & 1) != 0))))
        break;
        pbVar4 = (byte *)end;
      }
      if (*pbVar4 != 0x2c) {
        return (char *)pbVar4;
      }
      in = parseName((char *)pbVar4,end,&local_38);
      if (local_38 != (Name *)0x0) {
        iVar3._M_current =
             (names->super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (names->super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<ODDLParser::Name*,std::allocator<ODDLParser::Name*>>::
          _M_realloc_insert<ODDLParser::Name*const&>
                    ((vector<ODDLParser::Name*,std::allocator<ODDLParser::Name*>> *)names,iVar3,
                     &local_38);
        }
        else {
          *iVar3._M_current = local_38;
          pppNVar1 = &(names->
                      super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>).
                      _M_impl.super__Vector_impl_data._M_finish;
          *pppNVar1 = *pppNVar1 + 1;
        }
      }
      bVar2 = *in;
    }
  }
  return (char *)(byte *)in;
}

Assistant:

char *OpenDDLParser::parseReference(char *in, char *end, std::vector<Name *> &names) {
    if (nullptr == in || in == end) {
        return in;
    }

    Name *nextName(nullptr);
    in = parseName(in, end, &nextName);
    if (nextName) {
        names.push_back(nextName);
    }
    while (Grammar::CommaSeparator[0] == *in) {
        in = getNextSeparator(in, end);
        if (Grammar::CommaSeparator[0] == *in) {
            in = parseName(in, end, &nextName);
            if (nextName) {
                names.push_back(nextName);
            }
        } else {
            break;
        }
    }

    return in;
}